

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

bool __thiscall
Ptex::v2_4::PtexReader::MetaData::findKey(MetaData *this,char *key,int *index,MetaDataType *type)

{
  iterator iVar1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  allocator<char> local_49;
  key_type local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,key,&local_49);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>_>
          ::find(&(this->_map)._M_t,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node == p_Var3) {
    iVar2 = -1;
  }
  else {
    iVar2 = *(int *)((long)&iVar1._M_node[3]._M_left + 4);
    *type = *(MetaDataType *)&iVar1._M_node[2]._M_parent;
  }
  *index = iVar2;
  return (_Rb_tree_header *)iVar1._M_node != p_Var3;
}

Assistant:

virtual bool findKey(const char* key, int& index, MetaDataType& type)
	{
	    MetaMap::iterator iter = _map.find(key);
	    if (iter==_map.end()) {
		index = -1;
		return false;
	    }
	    index = iter->second.index;
	    type = iter->second.type;
	    return true;
	}